

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O3

void __thiscall
Deque<int,_std::allocator<int>_>::big_overtake(Deque<int,_std::allocator<int>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  DataBlock **ppDVar3;
  ulong uVar4;
  DataBlock **ppDVar5;
  DataBlock *pDVar6;
  long lVar7;
  
  sVar1 = (this->big_).size_;
  if ((sVar1 != (this->current_).size_) && (sVar2 = (this->big_).allocSize_, sVar1 != sVar2)) {
    ppDVar3 = (this->current_).begin_;
    uVar4 = (this->current_).allocSize_;
    ppDVar5 = (this->big_).end_;
    lVar7 = 0;
    if (uVar4 <= (ulong)((long)((long)ppDVar3 + (sVar1 * 8 - (long)(this->current_).arr_)) >> 3)) {
      lVar7 = -uVar4;
    }
    pDVar6 = ppDVar3[sVar1 + lVar7];
    (this->big_).end_ = ppDVar5 + 1;
    *ppDVar5 = pDVar6;
    (this->big_).size_ = sVar1 + 1;
    ppDVar3 = (this->big_).arr_;
    if ((long)(this->big_).end_ - (long)ppDVar3 >> 3 == sVar2) {
      (this->big_).end_ = ppDVar3;
    }
  }
  return;
}

Assistant:

std::size_t size() const {
        return size_;
    }